

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_still_impl.cpp
# Opt level: O0

void __thiscall
raspicam::_private::Private_Impl_Still::setRotation(Private_Impl_Still *this,int rotation)

{
  int rotation_local;
  Private_Impl_Still *this_local;
  
  for (rotation_local = rotation; rotation_local < 0; rotation_local = rotation_local + 0x168) {
  }
  if (0x167 < rotation_local) {
    rotation_local = rotation_local % 0x168;
  }
  this->rotation = rotation_local;
  this->changedSettings = true;
  return;
}

Assistant:

void Private_Impl_Still::setRotation ( int rotation ) {
            while ( rotation < 0 )
                rotation += 360;
            if ( rotation >= 360 )
                rotation = rotation % 360;
            this->rotation = rotation;
            changedSettings = true;
        }